

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall
cmFileWatcher::cmFileWatcher(cmFileWatcher *this,cmRealDirectoryWatcher *p,string *ps,Callback *cb)

{
  initializer_list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>
  __l;
  byte bVar1;
  _Any_data *local_a8;
  allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>
  local_69;
  _Any_data local_68 [2];
  _Any_data local_48 [2];
  Callback *local_28;
  Callback *cb_local;
  string *ps_local;
  cmRealDirectoryWatcher *p_local;
  cmFileWatcher *this_local;
  
  local_28 = cb;
  cb_local = (Callback *)ps;
  ps_local = (string *)p;
  p_local = (cmRealDirectoryWatcher *)this;
  cmIBaseWatcher::cmIBaseWatcher(&this->super_cmIBaseWatcher);
  (this->super_cmIBaseWatcher)._vptr_cmIBaseWatcher = (_func_int **)&PTR__cmFileWatcher_00acdad8;
  this->Parent = (cmRealDirectoryWatcher *)ps_local;
  std::__cxx11::string::string((string *)&this->PathSegment,(string *)cb_local);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
              *)local_68,cb);
  local_48[0]._8_8_ = 1;
  local_48[0]._0_8_ = local_68;
  std::
  allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>
  ::allocator(&local_69);
  __l._M_len = local_48[0]._8_8_;
  __l._M_array = (iterator)local_48[0]._0_8_;
  std::
  vector<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>_>
  ::vector(&this->CbList,__l,&local_69);
  std::
  allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>
  ::~allocator(&local_69);
  local_a8 = local_48;
  do {
    local_a8 = local_a8 + -2;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
                 *)local_a8);
  } while (local_a8 != local_68);
  if (ps_local != (string *)0x0) {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!ps.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileMonitor.cxx"
                    ,0xe9,
                    "cmFileWatcher::cmFileWatcher(cmRealDirectoryWatcher *, const std::string &, cmFileMonitor::Callback)"
                   );
    }
    cmVirtualDirectoryWatcher::AddChildWatcher
              ((cmVirtualDirectoryWatcher *)ps_local,(string *)cb_local,&this->super_cmIBaseWatcher)
    ;
    return;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileMonitor.cxx"
                ,0xe8,
                "cmFileWatcher::cmFileWatcher(cmRealDirectoryWatcher *, const std::string &, cmFileMonitor::Callback)"
               );
}

Assistant:

cmFileWatcher(cmRealDirectoryWatcher* p, const std::string& ps,
                cmFileMonitor::Callback cb)
    : Parent(p)
    , PathSegment(ps)
    , CbList({ std::move(cb) })
  {
    assert(p);
    assert(!ps.empty());
    p->AddChildWatcher(ps, this);
  }